

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::RemoveSuffix(ON_wString *this,wchar_t *suffix,ON_Locale *locale,bool bIgnoreCase)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  wchar_t *s_00;
  undefined7 in_register_00000009;
  byte in_R8B;
  int str_len;
  int suffix_length;
  wchar_t *str;
  bool bIgnoreCase_local;
  ON_Locale *locale_local;
  wchar_t *suffix_local;
  ON_wString *this_local;
  ON_wString *s;
  
  s_00 = operator_cast_to_wchar_t_((ON_wString *)suffix);
  element_count1 = Length((wchar_t *)locale);
  iVar2 = Length((ON_wString *)suffix);
  if (((element_count1 < 1) || (iVar2 < element_count1)) ||
     (bVar1 = Equal(s_00 + (iVar2 - element_count1),element_count1,(wchar_t *)locale,element_count1,
                    (ON_Locale *)CONCAT71(in_register_00000009,bIgnoreCase),(bool)(in_R8B & 1)),
     !bVar1)) {
    ON_wString(this,(ON_wString *)suffix);
  }
  else {
    ON_wString(this);
    CopyToArray(this,iVar2 - element_count1,s_00);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::RemoveSuffix(
  const wchar_t* suffix,
  const class ON_Locale& locale,
  bool bIgnoreCase
) const
{
  const wchar_t* str = static_cast<const wchar_t*>(*this);
  const int suffix_length = ON_wString::Length(suffix);
  const int str_len = Length();
  if (
    suffix_length > 0
    && str_len >= suffix_length
    && ON_wString::Equal(
      str + (str_len - suffix_length),
      suffix_length,
      suffix,
      suffix_length,
      locale,
      bIgnoreCase)
    )
  {
    ON_wString s;
    s.CopyToArray( str_len - suffix_length, str );
    return s;
  }

  return *this;
}